

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_lpf_reinit__internal(ma_lpf_config *pConfig,void *pHeap,ma_lpf *pLPF,ma_bool32 isNew)

{
  ma_format mVar1;
  int iVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  uint uVar5;
  uint uVar6;
  ma_result mVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  bool bVar12;
  ulong uVar13;
  double dVar14;
  size_t lpf1HeapSizeInBytes;
  ma_lpf1_config config;
  ma_lpf_heap_layout heapLayout;
  ulong uVar7;
  
  mVar4 = MA_INVALID_ARGS;
  mVar8 = mVar4;
  if (((pConfig != (ma_lpf_config *)0x0 && pLPF != (ma_lpf *)0x0) &&
      (((mVar1 = pConfig->format, mVar1 == ma_format_f32 || (mVar1 == ma_format_s16)) &&
       (mVar8 = MA_INVALID_OPERATION, pLPF->format == ma_format_unknown || pLPF->format == mVar1))))
     && (((pLPF->channels == 0 || (pLPF->channels == pConfig->channels)) &&
         (uVar9 = pConfig->order, mVar8 = mVar4, uVar9 < 9)))) {
    uVar6 = uVar9 & 1;
    uVar7 = (ulong)uVar6;
    uVar9 = uVar9 >> 1;
    if (isNew == 0) {
      if (pLPF->lpf1Count != uVar6) {
        return MA_INVALID_OPERATION;
      }
      if (pLPF->lpf2Count != uVar9) {
        return MA_INVALID_OPERATION;
      }
      heapLayout.sizeInBytes = 0;
      heapLayout.lpf1Offset = 0;
      heapLayout.lpf2Offset = 0;
    }
    else {
      mVar4 = ma_lpf_get_heap_layout(pConfig,&heapLayout);
      if (mVar4 != MA_SUCCESS) {
        return mVar4;
      }
      pLPF->_pHeap = pHeap;
      if (heapLayout.sizeInBytes != 0 && pHeap != (void *)0x0) {
        memset(pHeap,0,heapLayout.sizeInBytes);
      }
      pLPF->pLPF1 = (ma_lpf1 *)(heapLayout.lpf1Offset + (long)pHeap);
      pLPF->pLPF2 = (ma_lpf2 *)(heapLayout.lpf2Offset + (long)pHeap);
    }
    lVar11 = 0;
    for (uVar10 = 0; uVar7 != uVar10; uVar10 = uVar10 + 1) {
      config.cutoffFrequency = pConfig->cutoffFrequency;
      config.format = pConfig->format;
      config.channels = pConfig->channels;
      config._12_4_ = 0;
      config.sampleRate = pConfig->sampleRate;
      config.q = 0.5;
      if (isNew == 0) {
        mVar4 = ma_lpf1_reinit(&config,(ma_lpf1 *)((long)&pLPF->pLPF1->format + lVar11));
      }
      else {
        mVar4 = ma_lpf1_get_heap_size(&config,&lpf1HeapSizeInBytes);
        if (mVar4 == MA_SUCCESS) {
          mVar4 = ma_lpf1_init_preallocated
                            (&config,(void *)((long)pHeap +
                                             lpf1HeapSizeInBytes * uVar10 +
                                             heapLayout.lpf1Offset + uVar7 * 0x28),
                             (ma_lpf1 *)((long)&pLPF->pLPF1->format + lVar11));
        }
      }
      if (mVar4 != MA_SUCCESS) {
        lVar11 = 0;
        while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
          ma_lpf1_uninit((ma_lpf1 *)((long)&pLPF->pLPF1->format + lVar11),
                         (ma_allocation_callbacks *)0x0);
          lVar11 = lVar11 + 0x28;
        }
        return mVar4;
      }
      lVar11 = lVar11 + 0x28;
    }
    lVar11 = 0;
    for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
      iVar2 = (int)uVar10;
      if (uVar6 == 0) {
        iVar2 = iVar2 * 2;
        uVar5 = pConfig->order * 2;
      }
      else {
        uVar5 = pConfig->order;
      }
      dVar14 = sin((-3.141592653589793 / (double)uVar5) * (double)(iVar2 + 1) + 1.5707963267948966);
      dVar14 = 1.0 / (dVar14 + dVar14);
      config._8_8_ = ZEXT48(pConfig->sampleRate);
      config.cutoffFrequency = pConfig->cutoffFrequency;
      uVar13 = -(ulong)(dVar14 == 0.0);
      config.q = (double)(uVar13 & 0x3fe6a09edbf8b9bb | ~uVar13 & (ulong)dVar14);
      config.format = pConfig->format;
      config.channels = pConfig->channels;
      if (isNew == 0) {
        mVar4 = ma_lpf2_reinit(&config,(ma_lpf2 *)((long)&(pLPF->pLPF2->bq).format + lVar11));
      }
      else {
        mVar4 = ma_lpf2_get_heap_size(&config,&lpf1HeapSizeInBytes);
        if (mVar4 == MA_SUCCESS) {
          mVar4 = ma_lpf2_init_preallocated
                            (&config,(void *)((long)pHeap +
                                             lpf1HeapSizeInBytes * uVar10 +
                                             heapLayout.lpf2Offset + (uVar9 << 6)),
                             (ma_lpf2 *)((long)&(pLPF->pLPF2->bq).format + lVar11));
        }
      }
      if (mVar4 != MA_SUCCESS) {
        for (lVar11 = 0; uVar7 * 0x28 - lVar11 != 0; lVar11 = lVar11 + 0x28) {
          ma_lpf1_uninit((ma_lpf1 *)((long)&pLPF->pLPF1->format + lVar11),
                         (ma_allocation_callbacks *)0x0);
        }
        lVar11 = 0;
        while (bVar12 = uVar10 != 0, uVar10 = uVar10 - 1, bVar12) {
          ma_lpf2_uninit((ma_lpf2 *)((long)&(pLPF->pLPF2->bq).format + lVar11),
                         (ma_allocation_callbacks *)0x0);
          lVar11 = lVar11 + 0x40;
        }
        return mVar4;
      }
      lVar11 = lVar11 + 0x40;
    }
    pLPF->lpf1Count = uVar6;
    pLPF->lpf2Count = uVar9;
    mVar3 = pConfig->channels;
    pLPF->format = pConfig->format;
    pLPF->channels = mVar3;
    pLPF->sampleRate = pConfig->sampleRate;
    mVar8 = MA_SUCCESS;
  }
  return mVar8;
}

Assistant:

static ma_result ma_lpf_reinit__internal(const ma_lpf_config* pConfig, void* pHeap, ma_lpf* pLPF, ma_bool32 isNew)
{
    ma_result result;
    ma_uint32 lpf1Count;
    ma_uint32 lpf2Count;
    ma_uint32 ilpf1;
    ma_uint32 ilpf2;
    ma_lpf_heap_layout heapLayout;  /* Only used if isNew is true. */

    if (pLPF == NULL || pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only supporting f32 and s16. */
    if (pConfig->format != ma_format_f32 && pConfig->format != ma_format_s16) {
        return MA_INVALID_ARGS;
    }

    /* The format cannot be changed after initialization. */
    if (pLPF->format != ma_format_unknown && pLPF->format != pConfig->format) {
        return MA_INVALID_OPERATION;
    }

    /* The channel count cannot be changed after initialization. */
    if (pLPF->channels != 0 && pLPF->channels != pConfig->channels) {
        return MA_INVALID_OPERATION;
    }

    if (pConfig->order > MA_MAX_FILTER_ORDER) {
        return MA_INVALID_ARGS;
    }

    ma_lpf_calculate_sub_lpf_counts(pConfig->order, &lpf1Count, &lpf2Count);

    /* The filter order can't change between reinits. */
    if (!isNew) {
        if (pLPF->lpf1Count != lpf1Count || pLPF->lpf2Count != lpf2Count) {
            return MA_INVALID_OPERATION;
        }
    }

    if (isNew) {
        result = ma_lpf_get_heap_layout(pConfig, &heapLayout);
        if (result != MA_SUCCESS) {
            return result;
        }

        pLPF->_pHeap = pHeap;
        MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

        pLPF->pLPF1 = (ma_lpf1*)ma_offset_ptr(pHeap, heapLayout.lpf1Offset);
        pLPF->pLPF2 = (ma_lpf2*)ma_offset_ptr(pHeap, heapLayout.lpf2Offset);
    } else {
        MA_ZERO_OBJECT(&heapLayout);    /* To silence a compiler warning. */
    }

    for (ilpf1 = 0; ilpf1 < lpf1Count; ilpf1 += 1) {
        ma_lpf1_config lpf1Config = ma_lpf1_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency);

        if (isNew) {
            size_t lpf1HeapSizeInBytes;

            result = ma_lpf1_get_heap_size(&lpf1Config, &lpf1HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf1_init_preallocated(&lpf1Config, ma_offset_ptr(pHeap, heapLayout.lpf1Offset + (sizeof(ma_lpf1) * lpf1Count) + (ilpf1 * lpf1HeapSizeInBytes)), &pLPF->pLPF1[ilpf1]);
            }
        } else {
            result = ma_lpf1_reinit(&lpf1Config, &pLPF->pLPF1[ilpf1]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;

            for (jlpf1 = 0; jlpf1 < ilpf1; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    for (ilpf2 = 0; ilpf2 < lpf2Count; ilpf2 += 1) {
        ma_lpf2_config lpf2Config;
        double q;
        double a;

        /* Tempting to use 0.707107, but won't result in a Butterworth filter if the order is > 2. */
        if (lpf1Count == 1) {
            a = (1 + ilpf2*1) * (MA_PI_D/(pConfig->order*1));   /* Odd order. */
        } else {
            a = (1 + ilpf2*2) * (MA_PI_D/(pConfig->order*2));   /* Even order. */
        }
        q = 1 / (2*ma_cosd(a));

        lpf2Config = ma_lpf2_config_init(pConfig->format, pConfig->channels, pConfig->sampleRate, pConfig->cutoffFrequency, q);

        if (isNew) {
            size_t lpf2HeapSizeInBytes;

            result = ma_lpf2_get_heap_size(&lpf2Config, &lpf2HeapSizeInBytes);
            if (result == MA_SUCCESS) {
                result = ma_lpf2_init_preallocated(&lpf2Config, ma_offset_ptr(pHeap, heapLayout.lpf2Offset + (sizeof(ma_lpf2) * lpf2Count) + (ilpf2 * lpf2HeapSizeInBytes)), &pLPF->pLPF2[ilpf2]);
            }
        } else {
            result = ma_lpf2_reinit(&lpf2Config, &pLPF->pLPF2[ilpf2]);
        }

        if (result != MA_SUCCESS) {
            ma_uint32 jlpf1;
            ma_uint32 jlpf2;

            for (jlpf1 = 0; jlpf1 < lpf1Count; jlpf1 += 1) {
                ma_lpf1_uninit(&pLPF->pLPF1[jlpf1], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            for (jlpf2 = 0; jlpf2 < ilpf2; jlpf2 += 1) {
                ma_lpf2_uninit(&pLPF->pLPF2[jlpf2], NULL);  /* No need for allocation callbacks here since we used a preallocated heap allocation. */
            }

            return result;
        }
    }

    pLPF->lpf1Count  = lpf1Count;
    pLPF->lpf2Count  = lpf2Count;
    pLPF->format     = pConfig->format;
    pLPF->channels   = pConfig->channels;
    pLPF->sampleRate = pConfig->sampleRate;

    return MA_SUCCESS;
}